

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::checkForRequiredDecoration
               (uint32_t struct_id,function<bool_(spv::Decoration)> *checker,Op type,
               ValidationState_t *vstate)

{
  uint32_t struct_id_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  bool bVar1;
  Op OVar2;
  uint id_00;
  Op OVar3;
  Decoration DVar4;
  int iVar5;
  size_type sVar6;
  const_reference pvVar7;
  Instruction *this_00;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar8;
  reference pDVar9;
  reference puVar10;
  bool bVar11;
  function<bool_(spv::Decoration)> local_108;
  uint32_t local_e4;
  iterator iStack_e0;
  uint id_1;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Decoration *dec_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range3_1;
  Decoration *dec;
  iterator __end3;
  iterator __begin3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range3;
  Instruction *pIStack_60;
  bool found;
  Instruction *memberInst;
  ulong uStack_50;
  value_type id;
  size_t memberIdx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *members;
  ValidationState_t *vstate_local;
  function<bool_(spv::Decoration)> *pfStack_18;
  Op type_local;
  function<bool_(spv::Decoration)> *checker_local;
  uint32_t struct_id_local;
  
  members = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)vstate;
  vstate_local._4_4_ = type;
  pfStack_18 = checker;
  checker_local._0_4_ = struct_id;
  getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&memberIdx,struct_id,
                   vstate);
  local_30 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&memberIdx;
  for (uStack_50 = 0;
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_30),
      uStack_50 < sVar6; uStack_50 = uStack_50 + 1) {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_30,uStack_50);
    memberInst._4_4_ = *pvVar7;
    if (vstate_local._4_4_ == OpTypeMatrix) {
      pIStack_60 = ValidationState_t::FindDef((ValidationState_t *)members,memberInst._4_4_);
      while( true ) {
        OVar2 = Instruction::opcode(pIStack_60);
        bVar11 = true;
        if (OVar2 != OpTypeArray) {
          OVar2 = Instruction::opcode(pIStack_60);
          bVar11 = OVar2 == OpTypeRuntimeArray;
        }
        this = members;
        if (!bVar11) break;
        id_00 = Instruction::GetOperandAs<unsigned_int>(pIStack_60,1);
        pIStack_60 = ValidationState_t::FindDef((ValidationState_t *)this,id_00);
      }
      memberInst._4_4_ = Instruction::id(pIStack_60);
    }
    OVar2 = vstate_local._4_4_;
    this_00 = ValidationState_t::FindDef((ValidationState_t *)members,memberInst._4_4_);
    OVar3 = Instruction::opcode(this_00);
    if (OVar2 == OVar3) {
      bVar11 = false;
      psVar8 = ValidationState_t::id_decorations((ValidationState_t *)members,memberInst._4_4_);
      __end3 = std::
               set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
               ::begin(psVar8);
      dec = (Decoration *)
            std::
            set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
            ::end(psVar8);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&dec), bVar1) {
        pDVar9 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end3);
        DVar4 = Decoration::dec_type(pDVar9);
        bVar1 = std::function<bool_(spv::Decoration)>::operator()(checker,DVar4);
        if (bVar1) {
          bVar11 = true;
        }
        std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end3);
      }
      psVar8 = ValidationState_t::id_decorations
                         ((ValidationState_t *)members,(uint32_t)checker_local);
      __end3_1 = std::
                 set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                 ::begin(psVar8);
      dec_1 = (Decoration *)
              std::
              set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
              ::end(psVar8);
      while (bVar1 = std::operator!=(&__end3_1,(_Self *)&dec_1), bVar1) {
        pDVar9 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end3_1);
        DVar4 = Decoration::dec_type(pDVar9);
        bVar1 = std::function<bool_(spv::Decoration)>::operator()(checker,DVar4);
        if ((bVar1) && (iVar5 = Decoration::struct_member_index(pDVar9), (int)uStack_50 == iVar5)) {
          bVar11 = true;
        }
        std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end3_1);
      }
      if (!bVar11) {
        checker_local._7_1_ = 0;
        goto LAB_00288c21;
      }
    }
  }
  getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2,
                   (uint32_t)checker_local,OpTypeStruct,(ValidationState_t *)members);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2);
  iStack_e0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2);
  do {
    bVar11 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff20);
    if (!bVar11) {
      __range2._4_4_ = 0xb;
LAB_00288bfa:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin2);
      if (__range2._4_4_ == 0xb) {
        checker_local._7_1_ = 1;
      }
LAB_00288c21:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&memberIdx);
      return (bool)(checker_local._7_1_ & 1);
    }
    puVar10 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&__end2);
    struct_id_00 = *puVar10;
    local_e4 = struct_id_00;
    std::function<bool_(spv::Decoration)>::function(&local_108,checker);
    bVar11 = checkForRequiredDecoration
                       (struct_id_00,&local_108,vstate_local._4_4_,(ValidationState_t *)members);
    std::function<bool_(spv::Decoration)>::~function(&local_108);
    if (((bVar11 ^ 0xffU) & 1) != 0) {
      checker_local._7_1_ = 0;
      __range2._4_4_ = 1;
      goto LAB_00288bfa;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

bool checkForRequiredDecoration(uint32_t struct_id,
                                std::function<bool(spv::Decoration)> checker,
                                spv::Op type, ValidationState_t& vstate) {
  const auto& members = getStructMembers(struct_id, vstate);
  for (size_t memberIdx = 0; memberIdx < members.size(); memberIdx++) {
    auto id = members[memberIdx];
    if (type == spv::Op::OpTypeMatrix) {
      // Matrix decorations also apply to arrays of matrices.
      auto memberInst = vstate.FindDef(id);
      while (memberInst->opcode() == spv::Op::OpTypeArray ||
             memberInst->opcode() == spv::Op::OpTypeRuntimeArray) {
        memberInst = vstate.FindDef(memberInst->GetOperandAs<uint32_t>(1u));
      }
      id = memberInst->id();
    }
    if (type != vstate.FindDef(id)->opcode()) continue;
    bool found = false;
    for (auto& dec : vstate.id_decorations(id)) {
      if (checker(dec.dec_type())) found = true;
    }
    for (auto& dec : vstate.id_decorations(struct_id)) {
      if (checker(dec.dec_type()) &&
          (int)memberIdx == dec.struct_member_index()) {
        found = true;
      }
    }
    if (!found) {
      return false;
    }
  }
  for (auto id : getStructMembers(struct_id, spv::Op::OpTypeStruct, vstate)) {
    if (!checkForRequiredDecoration(id, checker, type, vstate)) {
      return false;
    }
  }
  return true;
}